

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CmdLine.h
# Opt level: O0

void __thiscall
TCLAP::CmdLine::parse
          (CmdLine *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *args)

{
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *this_00;
  bool bVar1;
  uint uVar2;
  int iVar3;
  reference pvVar4;
  ulong uVar5;
  size_type sVar6;
  reference ppAVar7;
  CmdLineParseException *pCVar8;
  ExitException *ee_1;
  ArgException *e;
  ExitException *ee;
  string local_140;
  allocator<char> local_119;
  string local_118;
  undefined1 local_f2;
  allocator<char> local_f1;
  string local_f0;
  _List_node_base *local_d0;
  iterator local_c8;
  _List_const_iterator<TCLAP::Arg_*> local_c0;
  iterator local_b8;
  _List_const_iterator<TCLAP::Arg_*> local_b0;
  ArgListIterator it;
  uint local_a0;
  int iStack_9c;
  bool matched;
  int i;
  int requiredCount;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_90;
  const_iterator local_88;
  undefined1 local_7a;
  allocator<char> local_79;
  string local_78;
  allocator<char> local_41;
  string local_40;
  int local_20;
  byte local_19;
  int estat;
  bool shouldExit;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *args_local;
  CmdLine *this_local;
  
  local_19 = 0;
  local_20 = 0;
  _estat = args;
  args_local = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)this;
  bVar1 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::empty(args);
  if (bVar1) {
    local_7a = 1;
    pCVar8 = (CmdLineParseException *)__cxa_allocate_exception(0x68);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_40,
               "The args vector must not be empty, the first entry should contain the program\'s name."
               ,&local_41);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_78,"undefined",&local_79);
    CmdLineParseException::CmdLineParseException(pCVar8,&local_40,&local_78);
    local_7a = 0;
    __cxa_throw(pCVar8,&CmdLineParseException::typeinfo,
                CmdLineParseException::~CmdLineParseException);
  }
  pvVar4 = std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::front(_estat);
  std::__cxx11::string::operator=((string *)&this->_progName,(string *)pvVar4);
  this_00 = _estat;
  local_90._M_current =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
       std::
       vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ::begin(_estat);
  __gnu_cxx::
  __normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
  ::__normal_iterator<std::__cxx11::string*>
            ((__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
              *)&local_88,&local_90);
  _i = std::
       vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ::erase(this_00,local_88);
  iStack_9c = 0;
  local_a0 = 0;
  do {
    uVar5 = (ulong)local_a0;
    sVar6 = std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::size(_estat);
    if (sVar6 <= uVar5) {
      if (iStack_9c < this->_numRequired) {
        missingArgsException(this);
      }
      if (iStack_9c <= this->_numRequired) {
        if ((local_19 & 1) == 0) {
          return;
        }
        exit(local_20);
      }
      ee._6_1_ = 1;
      pCVar8 = (CmdLineParseException *)__cxa_allocate_exception(0x68);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_118,"Too many arguments!",&local_119);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_140,"undefined",(allocator<char> *)((long)&ee + 7));
      CmdLineParseException::CmdLineParseException(pCVar8,&local_118,&local_140);
      ee._6_1_ = 0;
      __cxa_throw(pCVar8,&CmdLineParseException::typeinfo,
                  CmdLineParseException::~CmdLineParseException);
    }
    it._M_node._7_1_ = 0;
    local_b8._M_node =
         (_List_node_base *)
         std::__cxx11::list<TCLAP::Arg_*,_std::allocator<TCLAP::Arg_*>_>::begin(&this->_argList);
    std::_List_const_iterator<TCLAP::Arg_*>::_List_const_iterator(&local_b0,&local_b8);
    while( true ) {
      local_c8._M_node =
           (_List_node_base *)
           std::__cxx11::list<TCLAP::Arg_*,_std::allocator<TCLAP::Arg_*>_>::end(&this->_argList);
      std::_List_const_iterator<TCLAP::Arg_*>::_List_const_iterator(&local_c0,&local_c8);
      bVar1 = std::operator!=(&local_b0,&local_c0);
      if (!bVar1) break;
      ppAVar7 = std::_List_const_iterator<TCLAP::Arg_*>::operator*(&local_b0);
      uVar2 = (*(*ppAVar7)->_vptr_Arg[3])(*ppAVar7,&local_a0,_estat);
      if ((uVar2 & 1) != 0) {
        ppAVar7 = std::_List_const_iterator<TCLAP::Arg_*>::operator*(&local_b0);
        iVar3 = XorHandler::check(&this->_xorHandler,*ppAVar7);
        iStack_9c = iVar3 + iStack_9c;
        it._M_node._7_1_ = 1;
        break;
      }
      local_d0 = (_List_node_base *)std::_List_const_iterator<TCLAP::Arg_*>::operator++(&local_b0,0)
      ;
    }
    if ((it._M_node._7_1_ & 1) == 0) {
      pvVar4 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::operator[](_estat,(long)(int)local_a0);
      bVar1 = _emptyCombined(this,pvVar4);
      if (bVar1) {
        it._M_node._7_1_ = 1;
      }
    }
    if ((((it._M_node._7_1_ & 1) == 0) && (bVar1 = Arg::ignoreRest(), !bVar1)) &&
       ((this->_ignoreUnmatched & 1U) == 0)) {
      local_f2 = 1;
      pCVar8 = (CmdLineParseException *)__cxa_allocate_exception(0x68);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_f0,"Couldn\'t find match for argument",&local_f1);
      pvVar4 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::operator[](_estat,(long)(int)local_a0);
      CmdLineParseException::CmdLineParseException(pCVar8,&local_f0,pvVar4);
      local_f2 = 0;
      __cxa_throw(pCVar8,&CmdLineParseException::typeinfo,
                  CmdLineParseException::~CmdLineParseException);
    }
    local_a0 = local_a0 + 1;
  } while( true );
}

Assistant:

inline void CmdLine::parse(std::vector<std::string>& args)
{
	bool shouldExit = false;
	int estat = 0;
	try {
        if (args.empty()) {
            // https://sourceforge.net/p/tclap/bugs/30/
            throw CmdLineParseException("The args vector must not be empty, "
                                        "the first entry should contain the "
                                        "program's name.");
        }

		_progName = args.front();
		args.erase(args.begin());

		int requiredCount = 0;

		for (int i = 0; static_cast<unsigned int>(i) < args.size(); i++) 
		{
			bool matched = false;
			for (ArgListIterator it = _argList.begin();
			     it != _argList.end(); it++) {
				if ( (*it)->processArg( &i, args ) )
				{
					requiredCount += _xorHandler.check( *it );
					matched = true;
					break;
				}
			}

			// checks to see if the argument is an empty combined
			// switch and if so, then we've actually matched it
			if ( !matched && _emptyCombined( args[i] ) )
				matched = true;

			if ( !matched && !Arg::ignoreRest() && !_ignoreUnmatched)
				throw(CmdLineParseException("Couldn't find match "
				                            "for argument",
				                            args[i]));
		}

		if ( requiredCount < _numRequired )
			missingArgsException();

		if ( requiredCount > _numRequired )
			throw(CmdLineParseException("Too many arguments!"));

	} catch ( ArgException& e ) {
		// If we're not handling the exceptions, rethrow.
		if ( !_handleExceptions) {
			throw;
		}

		try {
			_output->failure(*this,e);
		} catch ( ExitException &ee ) {
			estat = ee.getExitStatus();
			shouldExit = true;
		}
	} catch (ExitException &ee) {
		// If we're not handling the exceptions, rethrow.
		if ( !_handleExceptions) {
			throw;
		}

		estat = ee.getExitStatus();
		shouldExit = true;
	}

	if (shouldExit)
		exit(estat);
}